

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qinputdevice.cpp
# Opt level: O1

void QInputDevicePrivate::registerDevice(QInputDevice *dev)

{
  QBasicMutex QVar1;
  QDebug this;
  QPodArrayOps<QInputDevice_const*> *this_00;
  QLoggingCategory *pQVar2;
  QBasicMutex *this_01;
  long in_FS_OFFSET;
  QByteArrayView QVar3;
  undefined8 local_78;
  undefined4 uStack_70;
  undefined8 uStack_6c;
  undefined4 local_64;
  char *local_60;
  QDebug local_58;
  Stream *local_50;
  undefined1 local_48 [8];
  QString local_40;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  if ((AtomicType)devicesMutex.d_ptr._q_value._M_b._M_p == (AtomicType)0x0) {
    LOCK();
    devicesMutex.d_ptr._q_value._M_b._M_p = (QBasicAtomicPointer<QMutexPrivate>)(AtomicType)0x1;
    UNLOCK();
    this_01 = (QBasicMutex *)dev;
  }
  else {
    this_01 = &devicesMutex;
    QBasicMutex::lockInternal();
  }
  this_00 = (QPodArrayOps<QInputDevice_const*> *)
            QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_deviceList>_>::
            operator()((QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_deviceList>_>
                        *)this_01);
  local_78 = dev;
  QtPrivate::QPodArrayOps<QInputDevice_const*>::emplace<QInputDevice_const*&>
            (this_00,*(qsizetype *)(this_00 + 0x10),(QInputDevice **)&local_78);
  QList<const_QInputDevice_*>::end((QList<const_QInputDevice_*> *)this_00);
  pQVar2 = QtPrivateLogging::lcQpaInputDevices();
  if (((pQVar2->field_2).bools.enabledInfo._q_value._M_base._M_i & 1U) != 0) {
    local_60 = pQVar2->name;
    local_78._0_4_ = 2;
    local_78._4_4_ = 0;
    uStack_70 = 0;
    uStack_6c = 0;
    local_64 = 0;
    QMessageLogger::info();
    this.stream = local_58.stream;
    QVar3.m_data = (storage_type *)0xa;
    QVar3.m_size = (qsizetype)&local_40;
    QString::fromUtf8(QVar3);
    QTextStream::operator<<(&(this.stream)->ts,&local_40);
    if (&(local_40.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_40.d.d)->super_QArrayData,2,0x10);
      }
    }
    if ((local_58.stream)->space == true) {
      QTextStream::operator<<(&(local_58.stream)->ts,' ');
    }
    local_50 = local_58.stream;
    (local_58.stream)->ref = (local_58.stream)->ref + 1;
    ::operator<<((Stream *)local_48,(QInputDevice *)&local_50);
    QDebug::~QDebug((QDebug *)local_48);
    QDebug::~QDebug((QDebug *)&local_50);
    QDebug::~QDebug(&local_58);
  }
  QVar1.d_ptr._q_value._M_b._M_p = devicesMutex.d_ptr._q_value._M_b._M_p;
  LOCK();
  devicesMutex.d_ptr._q_value._M_b._M_p = (QBasicAtomicPointer<QMutexPrivate>)(AtomicType)0x0;
  UNLOCK();
  if ((AtomicType)QVar1.d_ptr._q_value._M_b._M_p != (AtomicType)0x1) {
    QBasicMutex::unlockInternalFutex(&devicesMutex);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_28) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QInputDevicePrivate::registerDevice(const QInputDevice *dev)
{
    QMutexLocker lock(&devicesMutex);
    deviceList()->append(dev);
    qCInfo(lcQpaInputDevices) << "Registered" << dev;
}